

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_geometry_device.cpp
# Opt level: O0

void embree::addPoints(RTCScene scene,RTCGeometryType gtype,Vec3fa *pos)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  float *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  float fVar9;
  float fVar10;
  float fVar11;
  float nz;
  float ny;
  float nx;
  int i_1;
  Vec3fa *point_normals;
  float cb;
  float cg;
  float cr;
  float vr;
  float vz;
  float vy;
  float vx;
  int i;
  Vec4f *point_vertices;
  RTCGeometry geom;
  RandomSampler rng;
  uint hash;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_1;
  uint m_1;
  uint n_2;
  uint m_2;
  uint n_3;
  uint m_3;
  uint n_4;
  uint m_4;
  uint n_5;
  uint m_5;
  uint n_6;
  uint m_6;
  uint n_7;
  uint m_7;
  uint n_8;
  uint m_8;
  uint n_9;
  uint m_9;
  uint n_10;
  uint m_10;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  ulong uStack_8a0;
  float local_890;
  float local_88c;
  float local_888;
  int local_884;
  long local_880;
  undefined8 local_878;
  ulong uStack_870;
  float local_85c;
  float local_858;
  float local_854;
  float local_850;
  float local_84c;
  float local_848;
  float local_844;
  undefined4 local_840;
  float local_83c;
  float local_838;
  float local_834;
  undefined4 local_830;
  float local_82c;
  float local_828;
  float local_824;
  float local_820;
  float local_81c;
  float local_818;
  float local_814;
  float local_810;
  int local_80c;
  long local_808;
  undefined8 local_800;
  uint local_7f4;
  float *local_7f0;
  int local_7e4;
  undefined8 local_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  uint *local_7d0;
  uint *local_7c8;
  uint *local_7c0;
  uint *local_7b8;
  uint *local_7b0;
  uint *local_7a8;
  uint *local_7a0;
  uint *local_798;
  uint *local_790;
  uint *local_788;
  uint *local_780;
  float local_778;
  float local_774;
  float local_770;
  float local_76c;
  float *local_768;
  float *local_760;
  float *local_758;
  float *local_750;
  float *local_748;
  float *local_740;
  float *local_738;
  float *local_730;
  undefined4 *local_728;
  float *local_720;
  float *local_718;
  float *local_710;
  float *local_708;
  float *local_700;
  float *local_6f8;
  float *local_6f0;
  float *local_6e8;
  float *local_6e0;
  float *local_6d8;
  float *local_6d0;
  float local_6c4;
  float local_6c0;
  float local_6bc;
  undefined8 *local_6b8;
  float local_6ac;
  float local_6a8;
  float local_6a4;
  undefined8 *local_6a0;
  undefined1 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined1 *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_63c;
  undefined8 *local_638;
  undefined1 *local_630;
  float local_624;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined4 local_5d4;
  uint *local_5d0;
  uint *local_5c8;
  uint *local_5c0;
  uint *local_5b8;
  uint *local_5b0;
  uint *local_5a8;
  uint *local_5a0;
  uint *local_598;
  uint *local_590;
  uint *local_588;
  uint *local_580;
  uint *local_578;
  uint *local_570;
  uint *local_568;
  uint *local_560;
  uint *local_558;
  uint *local_550;
  uint *local_548;
  uint *local_540;
  uint *local_538;
  undefined4 local_530;
  undefined4 local_52c;
  uint local_528;
  undefined4 local_524;
  undefined4 local_520;
  int local_51c;
  undefined4 local_518;
  undefined4 local_514;
  int local_510;
  undefined4 local_50c;
  undefined4 local_508;
  int local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  int local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  int local_4ec;
  undefined4 local_4e8;
  undefined4 local_4e4;
  int local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  uint local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  int local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  int local_4bc;
  undefined8 local_4b8;
  ulong uStack_4b0;
  float local_4a8;
  float local_4a4;
  float local_4a0;
  undefined4 local_49c;
  undefined8 local_498;
  ulong uStack_490;
  float local_488;
  float local_484;
  float local_480;
  undefined4 local_47c;
  ulong local_478;
  undefined8 uStack_470;
  undefined1 local_468 [16];
  ulong local_458;
  undefined8 uStack_450;
  float local_43c;
  undefined1 local_438 [16];
  undefined4 local_41c;
  undefined1 local_418 [16];
  undefined4 local_3fc;
  undefined1 local_3f8 [16];
  float local_3dc;
  ulong local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  ulong local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  ulong local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  ulong local_318;
  undefined8 uStack_310;
  ulong local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined1 *local_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_7d0 = &local_7f4;
  local_7d4 = 0x2a;
  local_5e0 = 0xcc9e2d51;
  local_5e4 = 0x1b873593;
  local_5e8 = 0xf;
  local_5ec = 0xd;
  local_5f0 = 5;
  local_5f4 = 0xe6546b64;
  local_5dc = 0x6a5373fb;
  local_5d8 = 0xed18dd6;
  local_7d8 = 0x3e33aef8;
  local_7f4 = 0x3e33aef8;
  local_7f0 = in_RDX;
  local_7e4 = in_ESI;
  local_7e0 = in_RDI;
  local_5d4 = local_7d8;
  local_800 = rtcNewGeometry(g_device,in_ESI);
  local_808 = rtcSetNewGeometryBuffer(local_800,1,0,0x9004,0x10,0x200);
  for (local_80c = 0; local_80c < 0x200; local_80c = local_80c + 1) {
    local_7b0 = &local_7f4;
    local_528 = local_7f4;
    local_52c = 0x19660d;
    local_530 = 0x3c6ef35f;
    local_51c = local_7f4 * 0x19660d + 0x3c6ef35f;
    local_810 = (float)(local_7f4 >> 1) * 4.656613e-10 * 4.0 + -2.0;
    local_520 = 0x19660d;
    local_524 = 0x3c6ef35f;
    local_510 = local_51c * 0x19660d + 0x3c6ef35f;
    local_514 = 0x19660d;
    local_518 = 0x3c6ef35f;
    local_504 = local_510 * 0x19660d + 0x3c6ef35f;
    local_508 = 0x19660d;
    local_50c = 0x3c6ef35f;
    local_4f8 = local_504 * 0x19660d + 0x3c6ef35f;
    local_718 = local_7f0 + 1;
    local_720 = local_7f0 + 2;
    local_840 = 0;
    local_760 = &local_83c;
    local_710 = local_7f0;
    local_728 = &local_840;
    local_83c = *local_7f0;
    local_838 = *local_718;
    local_834 = *local_720;
    local_830 = 0;
    local_768 = &local_850;
    local_6e8 = &local_810;
    local_6f0 = &local_814;
    local_6f8 = &local_818;
    local_700 = &local_81c;
    local_84c = local_814;
    local_848 = local_818;
    local_844 = local_81c;
    local_758 = &local_82c;
    local_76c = local_83c + local_810;
    fVar9 = local_838 + local_814;
    fVar10 = local_834 + local_818;
    fVar11 = local_81c + 0.0;
    local_738 = &local_76c;
    local_740 = &local_770;
    local_748 = &local_774;
    local_750 = &local_778;
    local_828 = local_770;
    local_824 = local_774;
    local_820 = local_778;
    local_6d0 = (float *)(local_808 + (long)local_80c * 0x10);
    *local_6d0 = local_76c;
    local_6d0[1] = local_770;
    local_6d0[2] = local_774;
    local_6d0[3] = local_778;
    local_4fc = 0x19660d;
    local_500 = 0x3c6ef35f;
    local_4ec = local_4f8 * 0x19660d + 0x3c6ef35f;
    local_854 = (float)(local_7f4 >> 1) * 4.656613e-10;
    local_4f0 = 0x19660d;
    local_4f4 = 0x3c6ef35f;
    local_4e0 = local_4ec * 0x19660d + 0x3c6ef35f;
    local_858 = (float)(local_7f4 >> 1) * 4.656613e-10;
    local_4e4 = 0x19660d;
    local_4e8 = 0x3c6ef35f;
    local_85c = (float)(local_7f4 >> 1) * 4.656613e-10;
    local_6b8 = &local_878;
    local_47c = 0;
    local_498 = CONCAT44(local_858,local_854);
    uStack_490 = (ulong)(uint)local_85c;
    local_670 = (undefined8 *)(DAT_006043e8 + (long)local_80c * 0x10);
    local_678 = &local_878;
    *local_670 = local_498;
    local_670[1] = uStack_490;
    local_81c = (float)(local_7f4 >> 1) * 4.656613e-10 * 0.13 + 0.02;
    local_818 = (float)(local_7f4 >> 1) * 4.656613e-10 * 4.0 + -2.0;
    local_814 = (float)(local_7f4 >> 1) * 4.656613e-10 * 4.0 + -2.0;
    local_7a8 = local_7b0;
    local_7a0 = local_7b0;
    local_798 = local_7b0;
    local_790 = local_7b0;
    local_788 = local_7b0;
    local_780 = local_7b0;
    local_778 = fVar11;
    local_774 = fVar10;
    local_770 = fVar9;
    local_730 = local_758;
    local_708 = local_760;
    local_6e0 = local_768;
    local_6d8 = local_758;
    local_6c4 = local_85c;
    local_6c0 = local_858;
    local_6bc = local_854;
    local_5d0 = local_7b0;
    local_5c8 = local_7b0;
    local_5c0 = local_7b0;
    local_5b8 = local_7b0;
    local_5b0 = local_7b0;
    local_5a8 = local_7b0;
    local_5a0 = local_7b0;
    local_568 = local_7b0;
    local_560 = local_7b0;
    local_558 = local_7b0;
    local_550 = local_7b0;
    local_548 = local_7b0;
    local_540 = local_7b0;
    local_538 = local_7b0;
    local_488 = local_854;
    local_484 = local_858;
    local_480 = local_85c;
    local_878 = local_498;
    uStack_870 = uStack_490;
    local_850 = local_810;
    local_82c = local_76c;
    local_7f4 = local_4e0 * 0x19660d + 0x3c6ef35f;
  }
  if (local_7e4 == 0x34) {
    local_880 = rtcSetNewGeometryBuffer(local_800,3,0,0x9003,0x10,0x200);
    for (local_884 = 0; local_884 < 0x200; local_884 = local_884 + 1) {
      local_7c8 = &local_7f4;
      local_4d4 = local_7f4;
      local_4d8 = 0x19660d;
      local_4dc = 0x3c6ef35f;
      local_4c8 = local_7f4 * 0x19660d + 0x3c6ef35f;
      fVar9 = (float)(local_7f4 >> 1) * 4.656613e-10;
      local_888 = fVar9 + fVar9 + -1.0;
      local_4cc = 0x19660d;
      local_4d0 = 0x3c6ef35f;
      local_4bc = local_4c8 * 0x19660d + 0x3c6ef35f;
      fVar9 = (float)(local_7f4 >> 1) * 4.656613e-10;
      local_88c = fVar9 + fVar9 + -1.0;
      local_4c0 = 0x19660d;
      local_4c4 = 0x3c6ef35f;
      fVar9 = (float)(local_7f4 >> 1) * 4.656613e-10;
      local_890 = fVar9 + fVar9 + -1.0;
      local_6a0 = &local_8a8;
      local_49c = 0;
      local_4b8 = CONCAT44(local_88c,local_888);
      uStack_4b0 = (ulong)(uint)local_890;
      local_680 = (undefined8 *)(local_880 + (long)local_884 * 0x10);
      *local_680 = local_4b8;
      local_680[1] = uStack_4b0;
      local_668 = (undefined8 *)(local_880 + (long)local_884 * 0x10);
      local_2e0 = &local_618;
      uVar1 = *local_668;
      uVar2 = local_668[1];
      uVar3 = *local_668;
      uVar4 = local_668[1];
      local_258._0_4_ = (float)uVar1;
      local_258._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_250._0_4_ = (float)uVar2;
      uStack_250._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_268._0_4_ = (float)uVar3;
      local_268._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_260._0_4_ = (float)uVar4;
      uStack_260._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_2d8 = (float)local_258 * (float)local_268;
      fStack_2d4 = local_258._4_4_ * local_268._4_4_;
      fStack_2d0 = (float)uStack_250 * (float)uStack_260;
      fStack_2cc = uStack_250._4_4_ * uStack_260._4_4_;
      local_1b8 = CONCAT44(fStack_2d4,local_2d8);
      uStack_1b0 = CONCAT44(fStack_2cc,fStack_2d0);
      local_1a0 = &local_1e8;
      local_188 = &local_1f8;
      local_f8 = CONCAT44(fStack_2d4,fStack_2d4);
      uStack_f0 = CONCAT44(fStack_2d4,fStack_2d4);
      local_178 = &local_208;
      local_158 = CONCAT44(fStack_2d0,fStack_2d0);
      uStack_150 = CONCAT44(fStack_2d0,fStack_2d0);
      local_168 = &local_228;
      local_d8 = local_2d8 + fStack_2d4;
      fStack_d4 = fStack_2d4 + fStack_2d4;
      fStack_d0 = fStack_2d0 + fStack_2d4;
      fStack_cc = fStack_2cc + fStack_2d4;
      local_148 = CONCAT44(fStack_d4,local_d8);
      uStack_140 = CONCAT44(fStack_cc,fStack_d0);
      local_198 = &local_218;
      local_43c = local_d8 + fStack_2d0;
      fStack_134 = fStack_d4 + fStack_2d0;
      fStack_130 = fStack_d0 + fStack_2d0;
      fStack_12c = fStack_cc + fStack_2d0;
      local_1c8 = CONCAT44(fStack_134,local_43c);
      uStack_1c0 = CONCAT44(fStack_12c,fStack_130);
      local_3f8 = ZEXT416((uint)local_43c);
      local_458 = CONCAT44(0,local_43c);
      uStack_450 = 0;
      uStack_3d0 = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_458;
      local_468 = rsqrtss(auVar7,auVar7);
      local_3fc = 0x3fc00000;
      local_418 = ZEXT416(0x3fc00000);
      local_328 = local_468._0_8_;
      uVar8 = local_328;
      uStack_320 = local_468._8_8_;
      local_328._0_4_ = local_468._0_4_;
      local_318 = (ulong)(uint)((float)local_328 * 1.5);
      uStack_310 = 0;
      local_41c = 0xbf000000;
      local_438 = ZEXT416(0xbf000000);
      local_348 = local_438._0_8_;
      uStack_340 = 0;
      local_338 = (ulong)(uint)(local_43c * -0.5);
      uStack_330 = 0;
      local_368 = local_468._0_8_;
      uStack_360 = local_468._8_8_;
      local_63c = local_43c * -0.5 * (float)local_328;
      local_358 = (ulong)(uint)local_63c;
      uStack_350 = 0;
      local_388 = local_468._0_8_;
      uStack_380 = local_468._8_8_;
      local_378 = CONCAT44(local_468._4_4_,(float)local_328 * (float)local_328);
      uStack_370 = local_468._8_8_;
      local_3a8 = local_378;
      uStack_3a0 = local_468._8_8_;
      local_63c = local_63c * (float)local_328 * (float)local_328;
      local_398 = (ulong)(uint)local_63c;
      uStack_390 = 0;
      local_3c8 = local_398;
      uStack_3c0 = 0;
      local_63c = (float)local_328 * 1.5 + local_63c;
      local_3b8 = (ulong)(uint)local_63c;
      uStack_3b0 = 0;
      local_478 = local_3b8;
      uStack_470 = 0;
      local_308 = local_3b8;
      uStack_300 = 0;
      local_620 = &local_658;
      local_288 = CONCAT44(local_63c,local_63c);
      uStack_280 = CONCAT44(local_63c,local_63c);
      local_2c0 = &local_658;
      uVar5 = *local_668;
      uVar6 = local_668[1];
      local_278._0_4_ = (float)uVar5;
      local_278._4_4_ = (float)((ulong)uVar5 >> 0x20);
      uStack_270._0_4_ = (float)uVar6;
      uStack_270._4_4_ = (float)((ulong)uVar6 >> 0x20);
      local_2a8 = (float)local_278 * local_63c;
      fStack_2a4 = local_278._4_4_ * local_63c;
      fStack_2a0 = (float)uStack_270 * local_63c;
      fStack_29c = uStack_270._4_4_ * local_63c;
      local_8b8 = CONCAT44(fStack_2a4,local_2a8);
      uStack_8b0 = CONCAT44(fStack_29c,fStack_2a0);
      local_690 = (undefined8 *)(local_880 + (long)local_884 * 0x10);
      *local_690 = local_8b8;
      local_690[1] = uStack_8b0;
      local_7c0 = local_7c8;
      local_7b8 = local_7c8;
      local_6ac = local_890;
      local_6a8 = local_88c;
      local_6a4 = local_888;
      local_698 = (undefined1 *)&local_8b8;
      local_688 = local_6a0;
      local_660 = (undefined1 *)&local_8b8;
      local_638 = local_668;
      local_630 = (undefined1 *)&local_8b8;
      local_624 = local_63c;
      local_608 = local_668;
      local_600 = local_668;
      local_598 = local_7c8;
      local_590 = local_7c8;
      local_588 = local_7c8;
      local_580 = local_7c8;
      local_578 = local_7c8;
      local_570 = local_7c8;
      local_4a8 = local_888;
      local_4a4 = local_88c;
      local_4a0 = local_890;
      local_3dc = local_43c;
      local_3d8 = local_458;
      local_328 = uVar8;
      local_2f0 = local_668;
      local_2e8 = local_668;
      local_2c8 = local_2e0;
      local_2b8 = local_668;
      local_2b0 = (undefined1 *)&local_8b8;
      local_290 = (undefined1 *)&local_8b8;
      local_278 = uVar5;
      uStack_270 = uVar6;
      local_268 = uVar3;
      uStack_260 = uVar4;
      local_258 = uVar1;
      uStack_250 = uVar2;
      local_248 = local_63c;
      fStack_244 = local_63c;
      fStack_240 = local_63c;
      fStack_23c = local_63c;
      local_238 = local_63c;
      local_1d0 = local_2e0;
      local_190 = local_1a0;
      local_180 = local_1a0;
      local_170 = local_178;
      local_160 = local_198;
      local_138 = local_43c;
      local_128 = local_198;
      local_120 = local_178;
      local_118 = local_168;
      local_110 = local_188;
      local_108 = local_1a0;
      local_100 = local_168;
      local_e8 = local_1b8;
      uStack_e0 = uStack_1b0;
      local_c0 = local_168;
      local_b8 = local_188;
      local_b0 = local_1a0;
      local_a8 = local_1a0;
      local_a0 = local_188;
      local_98 = fStack_2d4;
      fStack_94 = fStack_2d4;
      fStack_90 = fStack_2d4;
      fStack_8c = fStack_2d4;
      local_88 = local_f8;
      uStack_80 = uStack_f0;
      local_78 = local_188;
      local_70 = local_1a0;
      local_68 = local_1b8;
      uStack_60 = uStack_1b0;
      local_58 = local_1a0;
      local_50 = local_178;
      local_48 = fStack_2d0;
      fStack_44 = fStack_2d0;
      fStack_40 = fStack_2d0;
      fStack_3c = fStack_2d0;
      local_38 = local_158;
      uStack_30 = uStack_150;
      local_28 = local_178;
      local_20 = local_1a0;
      local_18 = local_1b8;
      uStack_10 = uStack_1b0;
      local_8a8 = local_4b8;
      uStack_8a0 = uStack_4b0;
      local_7f4 = local_4bc * 0x19660d + 0x3c6ef35f;
      local_658 = local_288;
      uStack_650 = uStack_280;
      local_618 = local_1b8;
      uStack_610 = uStack_1b0;
      local_228 = local_148;
      uStack_220 = uStack_140;
      local_218 = local_1c8;
      uStack_210 = uStack_1c0;
      local_208 = local_158;
      uStack_200 = uStack_150;
      local_1f8 = local_f8;
      uStack_1f0 = uStack_f0;
      local_1e8 = local_1b8;
      uStack_1e0 = uStack_1b0;
    }
  }
  rtcCommitGeometry(local_800);
  rtcAttachGeometry(local_7e0,local_800);
  rtcReleaseGeometry(local_800);
  return;
}

Assistant:

void addPoints (RTCScene scene, RTCGeometryType gtype, const Vec3fa& pos)
{
  RandomSampler rng;
  RandomSampler_init(rng, 42);

#define COORD RandomSampler_get1D(rng) * 4.f - 2.f
#define RADIUS RandomSampler_get1D(rng) * 0.13f + 0.02f
#define COLOR RandomSampler_get1D(rng)
#define NORMAL RandomSampler_get1D(rng) * 2.f - 1.f

  RTCGeometry geom = rtcNewGeometry (g_device, gtype);
  Vec4f* point_vertices = (Vec4f*)rtcSetNewGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT4, sizeof(Vec4f), NUM_POINTS);

  for (int i = 0; i < NUM_POINTS; i++)
  {
    const float vx = COORD;
    const float vy = COORD;
    const float vz = COORD;
    const float vr = RADIUS;
    point_vertices[i] = Vec4f(pos.x,pos.y,pos.z,0.0f) + Vec4f(vx, vy, vz, vr);
    const float cr = COLOR;
    const float cg = COLOR;
    const float cb = COLOR;
    data.point_colors[i] = Vec3fa(cr,cg,cb);
  }

  if (gtype == RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT) {
    Vec3fa* point_normals = (Vec3fa*)rtcSetNewGeometryBuffer(geom,RTC_BUFFER_TYPE_NORMAL, 0, RTC_FORMAT_FLOAT3, sizeof(Vec3fa), NUM_POINTS);
    for (int i = 0; i < NUM_POINTS; i++) {
      const float nx = NORMAL;
      const float ny = NORMAL;
      const float nz = NORMAL;
      point_normals[i] = Vec3fa(nx,ny,nz);
      point_normals[i] = normalize(point_normals[i]);
    }
  }

  rtcCommitGeometry(geom);
  rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
}